

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019e090 = 0x2d2d2d2d2d2d2d;
    uRam000000000019e097._0_1_ = '-';
    uRam000000000019e097._1_1_ = '-';
    uRam000000000019e097._2_1_ = '-';
    uRam000000000019e097._3_1_ = '-';
    uRam000000000019e097._4_1_ = '-';
    uRam000000000019e097._5_1_ = '-';
    uRam000000000019e097._6_1_ = '-';
    uRam000000000019e097._7_1_ = '-';
    DAT_0019e080 = '-';
    DAT_0019e080_1._0_1_ = '-';
    DAT_0019e080_1._1_1_ = '-';
    DAT_0019e080_1._2_1_ = '-';
    DAT_0019e080_1._3_1_ = '-';
    DAT_0019e080_1._4_1_ = '-';
    DAT_0019e080_1._5_1_ = '-';
    DAT_0019e080_1._6_1_ = '-';
    uRam000000000019e088 = 0x2d2d2d2d2d2d2d;
    DAT_0019e08f = 0x2d;
    DAT_0019e070 = '-';
    DAT_0019e070_1._0_1_ = '-';
    DAT_0019e070_1._1_1_ = '-';
    DAT_0019e070_1._2_1_ = '-';
    DAT_0019e070_1._3_1_ = '-';
    DAT_0019e070_1._4_1_ = '-';
    DAT_0019e070_1._5_1_ = '-';
    DAT_0019e070_1._6_1_ = '-';
    uRam000000000019e078._0_1_ = '-';
    uRam000000000019e078._1_1_ = '-';
    uRam000000000019e078._2_1_ = '-';
    uRam000000000019e078._3_1_ = '-';
    uRam000000000019e078._4_1_ = '-';
    uRam000000000019e078._5_1_ = '-';
    uRam000000000019e078._6_1_ = '-';
    uRam000000000019e078._7_1_ = '-';
    DAT_0019e060 = '-';
    DAT_0019e060_1._0_1_ = '-';
    DAT_0019e060_1._1_1_ = '-';
    DAT_0019e060_1._2_1_ = '-';
    DAT_0019e060_1._3_1_ = '-';
    DAT_0019e060_1._4_1_ = '-';
    DAT_0019e060_1._5_1_ = '-';
    DAT_0019e060_1._6_1_ = '-';
    uRam000000000019e068._0_1_ = '-';
    uRam000000000019e068._1_1_ = '-';
    uRam000000000019e068._2_1_ = '-';
    uRam000000000019e068._3_1_ = '-';
    uRam000000000019e068._4_1_ = '-';
    uRam000000000019e068._5_1_ = '-';
    uRam000000000019e068._6_1_ = '-';
    uRam000000000019e068._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019e058._0_1_ = '-';
    uRam000000000019e058._1_1_ = '-';
    uRam000000000019e058._2_1_ = '-';
    uRam000000000019e058._3_1_ = '-';
    uRam000000000019e058._4_1_ = '-';
    uRam000000000019e058._5_1_ = '-';
    uRam000000000019e058._6_1_ = '-';
    uRam000000000019e058._7_1_ = '-';
    DAT_0019e09f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}